

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict * __thiscall
kj::ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::operator=
          (ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *this,
          ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *other
          )

{
  ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *other_local;
  ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *this_local;
  
  dispose(this);
  this->ptr = (Entry *)other->ptr;
  this->pos = (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)
              other->pos;
  this->endPtr = (Entry *)other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *
               )0x0;
  other->endPtr = (Entry *)0x0;
  return (ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *)this
  ;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }